

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

string * __thiscall
antlr::MismatchedTokenException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,MismatchedTokenException *this)

{
  char *__rhs;
  string *this_00;
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> elems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &bStack_128;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->mismatchType) {
  case 1:
    tokenName_abi_cxx11_(&local_a8,this,this->expecting);
    std::operator+(&local_c8,"expecting ",&local_a8);
    std::operator+(&local_108,&local_c8,", found \'");
    std::operator+(&local_e8,&local_108,&this->tokenText);
    std::operator+(&bStack_128,&local_e8,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_c8);
    this_00 = &local_a8;
    break;
  case 2:
    tokenName_abi_cxx11_(&local_108,this,this->expecting);
    std::operator+(&local_e8,"expecting anything but ",&local_108);
    std::operator+(&bStack_128,&local_e8,"; got it anyway");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = &local_108;
    break;
  case 3:
    tokenName_abi_cxx11_(&local_68,this,this->expecting);
    std::operator+(&local_48,"expecting token in range: ",&local_68);
    std::operator+(&local_a8,&local_48,"..");
    tokenName_abi_cxx11_(&local_88,this,this->upper);
    std::operator+(&local_c8,&local_a8,&local_88);
    std::operator+(&local_108,&local_c8,", found \'");
    std::operator+(&local_e8,&local_108,&this->tokenText);
    std::operator+(&bStack_128,&local_e8,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_0014f671;
  case 4:
    tokenName_abi_cxx11_(&local_68,this,this->expecting);
    std::operator+(&local_48,"expecting token NOT in range: ",&local_68);
    std::operator+(&local_a8,&local_48,"..");
    tokenName_abi_cxx11_(&local_88,this,this->upper);
    std::operator+(&local_c8,&local_a8,&local_88);
    std::operator+(&local_108,&local_c8,", found \'");
    std::operator+(&local_e8,&local_108,&this->tokenText);
    std::operator+(&bStack_128,&local_e8,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0014f671:
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = &local_68;
    break;
  case 5:
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"expecting ",(allocator<char> *)&local_c8);
    __rhs = "";
    if (this->mismatchType == 6) {
      __rhs = "NOT ";
    }
    std::operator+(&local_e8,&local_108,__rhs);
    std::operator+(&bStack_128,&local_e8,"one of (");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    BitSet::toArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,&this->set);
    for (uVar1 = 0;
        (ulong)uVar1 <
        (ulong)((long)(local_108._M_string_length - (long)local_108._M_dataplus._M_p) >> 2);
        uVar1 = uVar1 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      tokenName_abi_cxx11_(&bStack_128,this,*(int *)(local_108._M_dataplus._M_p + (ulong)uVar1 * 4))
      ;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_128);
    }
    std::operator+(&local_e8,"), found \'",&this->tokenText);
    std::operator+(&bStack_128,&local_e8,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    return __return_storage_ptr__;
  default:
    std::__cxx11::string::string
              ((string *)&bStack_128,
               (string *)&(this->super_RecognitionException).super_ANTLRException.text);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_128);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string MismatchedTokenException::getMessage() const
{
	ANTLR_USE_NAMESPACE(std)string s;
	switch (mismatchType) {
	case TOKEN:
		s += "expecting " + tokenName(expecting) + ", found '" + tokenText + "'";
		break;
	case NOT_TOKEN:
		s += "expecting anything but " + tokenName(expecting) + "; got it anyway";
		break;
	case RANGE:
		s += "expecting token in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case NOT_RANGE:
		s += "expecting token NOT in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case SET:
	case NOT_SET:
		{
			s += ANTLR_USE_NAMESPACE(std)string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems = set.toArray();
			for ( unsigned int i = 0; i < elems.size(); i++ )
			{
				s += " ";
				s += tokenName(elems[i]);
			}
			s += "), found '" + tokenText + "'";
		}
		break;
	default:
		s = RecognitionException::getMessage();
		break;
	}
	return s;
}